

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CamCal.cpp
# Opt level: O0

void __thiscall CCamCal::CCamCal(CCamCal *this)

{
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> local_40;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> local_28;
  CCamCal *local_10;
  CCamCal *this_local;
  
  local_10 = this;
  CCfg::CCfg(&this->m_oCfg);
  cv::Mat::Mat(&this->m_oImgFrm);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector(&this->m_vo3dPt);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector(&this->m_vo2dPt);
  cv::Mat::Mat(&this->m_oHomoMat);
  memset(&local_28,0,0x18);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector(&local_28);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::swap
            (&local_28,&this->m_vo3dPt);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~vector(&local_28);
  memset(&local_40,0,0x18);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector(&local_40);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::swap
            (&local_40,&this->m_vo2dPt);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~vector(&local_40);
  return;
}

Assistant:

CCamCal::CCamCal(void)
{
	// list of 3D points for PnP
	std::vector<cv::Point2f>().swap(m_vo3dPt);

	// list of 2D points for PnP
	std::vector<cv::Point2f>().swap(m_vo2dPt);
}